

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 03-decompose.cpp
# Opt level: O0

void __thiscall anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this)

{
  bool bVar1;
  failure *pfVar2;
  string local_238 [39];
  allocator local_211;
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [32];
  location local_1c8;
  void *local_1a0;
  void *local_198;
  expression_decomposer local_189;
  void **local_188;
  undefined1 local_180 [8];
  result failed_1;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  location local_90;
  void *local_68 [3];
  void *local_50;
  expression_decomposer local_41;
  void **local_40;
  undefined1 local_38 [8];
  result failed;
  anon_class_1_0_00000001 *this_local;
  
  failed._32_8_ = this;
  do {
    local_50 = ptr();
    local_40 = (void **)lest::expression_decomposer::operator<<(&local_41,&local_50);
    local_68[0] = (void *)0x0;
    lest::expression_lhs<void*const&>::operator==
              ((result *)local_38,(expression_lhs<void*const&> *)&local_40,local_68);
    bVar1 = lest::result::operator_cast_to_bool((result *)local_38);
    if (bVar1) {
      pfVar2 = (failure *)__cxa_allocate_exception(0x78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]lest/example/03-decompose.cpp"
                 ,&local_b1);
      lest::location::location(&local_90,(text *)local_b0,0x45);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,"ptr() == nullptr",&local_d9);
      std::__cxx11::string::string(local_100,(string *)&failed);
      lest::failure::failure(pfVar2,&local_90,(string *)local_d8,(string *)local_100);
      __cxa_throw(pfVar2,&lest::failure::typeinfo,lest::failure::~failure);
    }
    lest::result::~result((result *)local_38);
    bVar1 = lest::is_false();
  } while (bVar1);
  do {
    local_198 = ptr();
    local_188 = (void **)lest::expression_decomposer::operator<<(&local_189,&local_198);
    local_1a0 = (void *)0x0;
    lest::expression_lhs<void*const&>::operator!=
              ((result *)local_180,(expression_lhs<void*const&> *)&local_188,&local_1a0);
    bVar1 = lest::result::operator_cast_to_bool((result *)local_180);
    if (bVar1) {
      pfVar2 = (failure *)__cxa_allocate_exception(0x78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]lest/example/03-decompose.cpp"
                 ,&local_1e9);
      lest::location::location(&local_1c8,(text *)local_1e8,0x46);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_210,"ptr() != nullptr",&local_211);
      std::__cxx11::string::string(local_238,(string *)&failed_1);
      lest::failure::failure(pfVar2,&local_1c8,(string *)local_210,(string *)local_238);
      __cxa_throw(pfVar2,&lest::failure::typeinfo,lest::failure::~failure);
    }
    lest::result::~result((result *)local_180);
    bVar1 = lest::is_false();
  } while (bVar1);
  return;
}

Assistant:

bool t() { return true; }